

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

void string(Vm *vm,_Bool quotation_marks)

{
  char **ppcVar1;
  HTItemKey key;
  ValueType VVar2;
  uint32_t uVar3;
  ObjString *object;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar4;
  size_t length;
  char *start;
  CrispyValue value;
  CrispyValue CVar5;
  
  ppcVar1 = &(vm->compiler).token.start;
  key = *(HTItemKey *)ppcVar1;
  CVar5 = ht_get(&vm->strings,*(HTItemKey *)ppcVar1);
  if (CVar5.type == NIL) {
    start = (vm->compiler).token.start;
    if (quotation_marks) {
      start = start + 1;
      length = (vm->compiler).token.length - 2;
    }
    else {
      length = (vm->compiler).token.length;
    }
    object = new_string(vm,start,length);
    CVar5 = create_object(&object->object);
    aVar4 = CVar5.field_1;
    VVar2 = CVar5.type;
    CVar5._4_4_ = 0;
    CVar5.type = VVar2;
    CVar5.field_1.p_value = aVar4.p_value;
    ht_put(&vm->strings,key,CVar5);
  }
  else {
    CVar5 = create_object(CVar5.field_1.o_value);
    aVar4 = CVar5.field_1;
    VVar2 = CVar5.type;
  }
  value._4_4_ = 0;
  value.type = VVar2;
  value.field_1.p_value = aVar4.p_value;
  uVar3 = add_constant(vm,value);
  if ((uVar3 & 0xff00) != 0) {
    emit_short_arg(vm,OP_LDC_W,(uint8_t)(uVar3 >> 8),(uint8_t)uVar3);
    return;
  }
  emit_byte_arg(vm,OP_LDC,(uint8_t)uVar3);
  return;
}

Assistant:

static Token string(Scanner *scanner, char quotation_mark) {
    while (!at_end(scanner) && peek(scanner) != quotation_mark) {
        advance(scanner);
    }

    if (at_end(scanner)) {
        return error_token(scanner, "Unterminated String");
    }

    advance(scanner);
    return make_token(scanner, TOKEN_STRING);
}